

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemKeyOwner(ImGuiKey key,ImGuiInputFlags flags)

{
  ImGuiID owner_id;
  uint uVar1;
  
  owner_id = (GImGui->LastItemData).ID;
  if ((owner_id != 0) && ((GImGui->HoveredId == owner_id || (GImGui->ActiveId == owner_id)))) {
    uVar1 = flags | 0x30;
    if ((flags & 0x30U) != 0) {
      uVar1 = flags;
    }
    if (((uVar1 & 0x10) != 0 && GImGui->HoveredId == owner_id) ||
       ((uVar1 & 0x20) != 0 && GImGui->ActiveId == owner_id)) {
      SetKeyOwner(key,owner_id,uVar1 & 0xffffffcf);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemKeyOwner(ImGuiKey key, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0 || (g.HoveredId != id && g.ActiveId != id))
        return;
    if ((flags & ImGuiInputFlags_CondMask_) == 0)
        flags |= ImGuiInputFlags_CondDefault_;
    if ((g.HoveredId == id && (flags & ImGuiInputFlags_CondHovered)) || (g.ActiveId == id && (flags & ImGuiInputFlags_CondActive)))
    {
        IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetItemKeyOwner) == 0); // Passing flags not supported by this function!
        SetKeyOwner(key, id, flags & ~ImGuiInputFlags_CondMask_);
    }
}